

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerApp::OnEnergyReport
          (CommissionerApp *this,string *aPeerAddr,ChannelMask *aChannelMask,ByteArray *aEnergyList)

{
  pointer puVar1;
  undefined4 uVar2;
  mapped_type *pmVar3;
  Address addr;
  undefined1 local_98 [40];
  pointer puStack_70;
  Address local_68;
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_48;
  
  local_68.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Address::Set((Error *)local_98,&local_68,aPeerAddr);
  uVar2 = local_98._0_4_;
  if ((pointer)local_98._8_8_ != (pointer)(local_98 + 0x18)) {
    operator_delete((void *)local_98._8_8_);
  }
  if (uVar2 == kNone) {
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
              *)local_98,aChannelMask);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_98 + 0x18),
               aEnergyList);
    pmVar3 = std::
             map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
             ::operator[](&this->mEnergyReports,&local_68);
    local_48.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pmVar3->mChannelMask).
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pmVar3->mChannelMask).
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pmVar3->mChannelMask).
         super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pmVar3->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98._0_8_;
    (pmVar3->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_98._8_8_;
    (pmVar3->mChannelMask).
    super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98._16_8_;
    local_98._0_8_ = (pointer)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (pointer)0x0;
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_48);
    puVar1 = (pmVar3->mEnergyList).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pmVar3->mEnergyList).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98._24_8_;
    (pmVar3->mEnergyList).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_98._32_8_;
    (pmVar3->mEnergyList).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puStack_70;
    puStack_70 = (pointer)0x0;
    local_98._24_8_ = (void *)0x0;
    local_98._32_8_ = 0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1);
    }
    if ((void *)local_98._24_8_ != (void *)0x0) {
      operator_delete((void *)local_98._24_8_);
    }
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector((vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
               *)local_98);
    if (local_68.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.mBytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  abort();
}

Assistant:

void CommissionerApp::OnEnergyReport(const std::string &aPeerAddr,
                                     const ChannelMask &aChannelMask,
                                     const ByteArray   &aEnergyList)
{
    Address addr;

    SuccessOrDie(addr.Set(aPeerAddr));

    // FIXME(wgtdkp): synchronization
    mEnergyReports[addr] = {aChannelMask, aEnergyList};
}